

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O1

int Cmd_CommandAbcPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  Abc_Frame_t *pAVar2;
  Gia_Man_t **ppGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  FILE *__stream;
  Vec_Int_t *pVVar11;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p;
  Gia_Man_t *pGVar12;
  uint uVar13;
  int iVar14;
  abctime time;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint *puVar20;
  long lVar21;
  char *pFileOut;
  char *pFileIn;
  timespec ts;
  char *local_88;
  uint *local_80;
  char *local_78;
  uint *local_70;
  char **local_68;
  uint local_5c;
  Abc_Frame_t *local_58;
  Gia_Man_t **local_50;
  timespec local_48;
  ulong local_38;
  
  local_68 = argv;
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    if (argc == 2) {
      iVar5 = 0x82d577;
      iVar4 = strcmp(argv[1],"-h");
      if (iVar4 == 0) {
        puVar7 = (uint *)malloc(0x10);
        puVar7[0] = 100;
        puVar7[1] = 0;
        pvVar8 = malloc(100);
        *(void **)(puVar7 + 2) = pvVar8;
        pcVar9 = Abc_GetBinaryName(pAbc,iVar5,local_68);
        sVar10 = strlen(pcVar9);
        local_80 = puVar7;
        if (0 < (int)(uint)sVar10) {
          uVar17 = *puVar7;
          uVar13 = puVar7[1];
          pvVar8 = *(void **)(puVar7 + 2);
          uVar18 = 0;
          do {
            cVar1 = pcVar9[uVar18];
            if ((int)uVar18 + uVar13 == uVar17) {
              if ((int)uVar17 < 0x10) {
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc(0x10);
                }
                else {
                  pvVar8 = realloc(pvVar8,0x10);
                }
                uVar17 = 0x10;
              }
              else {
                uVar15 = uVar17 * 2;
                if (SBORROW4(uVar17,uVar15) != 0 < (int)uVar17) {
                  uVar17 = uVar15;
                  if (pvVar8 == (void *)0x0) {
                    pvVar8 = malloc((ulong)uVar15);
                  }
                  else {
                    pvVar8 = realloc(pvVar8,(ulong)uVar15);
                  }
                }
              }
            }
            *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar13) = cVar1;
            uVar18 = uVar18 + 1;
          } while (((uint)sVar10 & 0x7fffffff) != uVar18);
          local_80[1] = uVar13 + (int)uVar18;
          *local_80 = uVar17;
          *(void **)(local_80 + 2) = pvVar8;
        }
        uVar17 = *local_80;
        uVar13 = local_80[1];
        pvVar8 = *(void **)(local_80 + 2);
        lVar19 = 0;
        do {
          cVar1 = " -abc "[lVar19];
          if (uVar13 + (int)lVar19 == uVar17) {
            if ((int)uVar17 < 0x10) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(pvVar8,0x10);
              }
              uVar17 = 0x10;
            }
            else {
              uVar15 = uVar17 * 2;
              if (SBORROW4(uVar17,uVar15) != 0 < (int)uVar17) {
                uVar17 = uVar15;
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar15);
                }
                else {
                  pvVar8 = realloc(pvVar8,(ulong)uVar15);
                }
              }
            }
          }
          puVar7 = local_80;
          *(char *)((long)pvVar8 + lVar19 + (int)uVar13) = cVar1;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 6);
        local_80[1] = uVar13 + 6;
        *local_80 = uVar17;
        *(void **)(local_80 + 2) = pvVar8;
        pcVar9 = *local_68;
        sVar10 = strlen(pcVar9);
        if (0 < (int)(uint)sVar10) {
          uVar17 = *puVar7;
          uVar13 = puVar7[1];
          pvVar8 = *(void **)(puVar7 + 2);
          uVar18 = 0;
          do {
            cVar1 = pcVar9[uVar18];
            if (uVar13 + (int)uVar18 == uVar17) {
              if ((int)uVar17 < 0x10) {
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc(0x10);
                }
                else {
                  pvVar8 = realloc(pvVar8,0x10);
                }
                uVar17 = 0x10;
              }
              else {
                uVar15 = uVar17 * 2;
                if (SBORROW4(uVar17,uVar15) != 0 < (int)uVar17) {
                  uVar17 = uVar15;
                  if (pvVar8 == (void *)0x0) {
                    pvVar8 = malloc((ulong)uVar15);
                  }
                  else {
                    pvVar8 = realloc(pvVar8,(ulong)uVar15);
                  }
                }
              }
            }
            *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar13) = cVar1;
            uVar18 = uVar18 + 1;
          } while (((uint)sVar10 & 0x7fffffff) != uVar18);
          local_80[1] = uVar13 + (int)uVar18;
          *local_80 = uVar17;
          *(void **)(local_80 + 2) = pvVar8;
          puVar7 = local_80;
        }
        uVar17 = *puVar7;
        uVar13 = puVar7[1];
        pvVar8 = *(void **)(puVar7 + 2);
        lVar21 = (long)(int)uVar13 << 0x20;
        lVar19 = 0;
        uVar15 = uVar13;
        do {
          uVar16 = uVar15;
          cVar1 = "%s -h"[lVar19 + 2];
          if (uVar16 == uVar17) {
            if ((int)uVar17 < 0x10) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(pvVar8,0x10);
              }
              uVar17 = 0x10;
            }
            else {
              uVar15 = uVar17 * 2;
              if (SBORROW4(uVar17,uVar15) != 0 < (int)uVar17) {
                uVar17 = uVar15;
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar15);
                }
                else {
                  pvVar8 = realloc(pvVar8,(ulong)uVar15);
                }
              }
            }
          }
          puVar7 = local_80;
          *(char *)((long)pvVar8 + lVar19 + (int)uVar13) = cVar1;
          lVar19 = lVar19 + 1;
          uVar15 = uVar16 + 1;
          lVar21 = lVar21 + 0x100000000;
        } while (lVar19 != 3);
        local_80[1] = uVar15;
        *local_80 = uVar17;
        *(void **)(local_80 + 2) = pvVar8;
        if (uVar15 == uVar17) {
          if ((int)uVar17 < 0x10) {
            if (*(void **)(local_80 + 2) == (void *)0x0) {
              pvVar8 = malloc(0x10);
            }
            else {
              pvVar8 = realloc(*(void **)(local_80 + 2),0x10);
            }
            uVar13 = 0x10;
          }
          else {
            uVar13 = uVar17 * 2;
            if (SBORROW4(uVar17,uVar13) == 0 < (int)uVar17) goto LAB_002be7bc;
            if (*(void **)(local_80 + 2) == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar13);
            }
            else {
              pvVar8 = realloc(*(void **)(local_80 + 2),(ulong)uVar13);
            }
          }
          *(void **)(puVar7 + 2) = pvVar8;
          *puVar7 = uVar13;
        }
LAB_002be7bc:
        pcVar9 = *(char **)(puVar7 + 2);
        puVar7[1] = uVar16 + 2;
        pcVar9[lVar21 >> 0x20] = '\0';
        Util_SignalSystem(pcVar9);
        if (pcVar9 != (char *)0x0) {
          free(pcVar9);
          puVar7[2] = 0;
          puVar7[3] = 0;
        }
        free(puVar7);
        return 1;
      }
    }
    pcVar9 = "Current AIG does not exist (try command &ps).\n";
    goto LAB_002bda10;
  }
  iVar4 = Util_SignalTmpFile("__abctmp_",".aig",&local_78);
  if (iVar4 != -1) {
    close(iVar4);
    iVar4 = Util_SignalTmpFile("__abctmp_",".out",&local_88);
    if (iVar4 != -1) {
      close(iVar4);
      iVar4 = strcmp(local_68[(long)argc + -1],"!");
      if (iVar4 == 0) {
        Abc_Print(0,"Input file \"%s\" and output file \"%s\" are not deleted.\n",local_78);
        local_80 = (uint *)CONCAT44(local_80._4_4_,argc + -1);
      }
      else {
        local_80 = (uint *)CONCAT44(local_80._4_4_,argc);
      }
      local_5c = (uint)(iVar4 == 0);
      pcVar9 = local_78;
      Gia_AigerWrite(pAbc->pGia,local_78,0,0);
      iVar4 = (int)pcVar9;
      puVar7 = (uint *)malloc(0x10);
      puVar7[0] = 100;
      puVar7[1] = 0;
      pvVar8 = malloc(100);
      *(void **)(puVar7 + 2) = pvVar8;
      pcVar9 = Abc_GetBinaryName(pAbc,iVar4,local_68);
      sVar10 = strlen(pcVar9);
      local_70 = puVar7;
      local_58 = pAbc;
      if (0 < (int)(uint)sVar10) {
        uVar17 = puVar7[1];
        uVar13 = *puVar7;
        pvVar8 = *(void **)(puVar7 + 2);
        uVar18 = 0;
        do {
          cVar1 = pcVar9[uVar18];
          if (uVar17 + (int)uVar18 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(pvVar8,0x10);
              }
              uVar13 = 0x10;
            }
            else {
              uVar15 = uVar13 * 2;
              if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
                uVar13 = uVar15;
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar15);
                }
                else {
                  pvVar8 = realloc(pvVar8,(ulong)uVar15);
                }
              }
            }
          }
          *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar17) = cVar1;
          uVar18 = uVar18 + 1;
        } while (((uint)sVar10 & 0x7fffffff) != uVar18);
        local_70[1] = uVar17 + (int)uVar18;
        *local_70 = uVar13;
        *(void **)(local_70 + 2) = pvVar8;
      }
      local_50 = &local_58->pGia;
      uVar17 = local_70[1];
      uVar13 = *local_70;
      pvVar8 = *(void **)(local_70 + 2);
      lVar19 = 0;
      do {
        cVar1 = " -abc"[lVar19];
        if (uVar17 + (int)lVar19 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc(0x10);
            }
            else {
              pvVar8 = realloc(pvVar8,0x10);
            }
            uVar13 = 0x10;
          }
          else {
            uVar15 = uVar13 * 2;
            if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
              uVar13 = uVar15;
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc((ulong)uVar15);
              }
              else {
                pvVar8 = realloc(pvVar8,(ulong)uVar15);
              }
            }
          }
        }
        *(char *)((long)pvVar8 + lVar19 + (int)uVar17) = cVar1;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 5);
      uVar15 = uVar17 + 5;
      local_70[1] = uVar15;
      *local_70 = uVar13;
      *(void **)(local_70 + 2) = pvVar8;
      lVar19 = 0;
      do {
        cVar1 = " -input="[lVar19];
        if (uVar15 + (int)lVar19 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc(0x10);
            }
            else {
              pvVar8 = realloc(pvVar8,0x10);
            }
            uVar13 = 0x10;
          }
          else {
            uVar16 = uVar13 * 2;
            if (SBORROW4(uVar13,uVar16) != 0 < (int)uVar13) {
              uVar13 = uVar16;
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc((ulong)uVar16);
              }
              else {
                pvVar8 = realloc(pvVar8,(ulong)uVar16);
              }
            }
          }
        }
        puVar7 = local_70;
        pcVar9 = local_78;
        *(char *)((long)pvVar8 + lVar19 + (int)uVar15) = cVar1;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      local_70[1] = uVar17 + 0xd;
      *local_70 = uVar13;
      *(void **)(local_70 + 2) = pvVar8;
      sVar10 = strlen(local_78);
      if (0 < (int)(uint)sVar10) {
        uVar17 = puVar7[1];
        uVar13 = *puVar7;
        pvVar8 = *(void **)(puVar7 + 2);
        uVar18 = 0;
        do {
          cVar1 = pcVar9[uVar18];
          if (uVar17 + (int)uVar18 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(pvVar8,0x10);
              }
              uVar13 = 0x10;
            }
            else {
              uVar15 = uVar13 * 2;
              if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
                uVar13 = uVar15;
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar15);
                }
                else {
                  pvVar8 = realloc(pvVar8,(ulong)uVar15);
                }
              }
            }
          }
          *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar17) = cVar1;
          uVar18 = uVar18 + 1;
        } while (((uint)sVar10 & 0x7fffffff) != uVar18);
        local_70[1] = uVar17 + (int)uVar18;
        *local_70 = uVar13;
        *(void **)(local_70 + 2) = pvVar8;
        puVar7 = local_70;
      }
      uVar17 = puVar7[1];
      uVar13 = *puVar7;
      pvVar8 = *(void **)(puVar7 + 2);
      lVar19 = 0;
      do {
        cVar1 = " -output="[lVar19];
        if (uVar17 + (int)lVar19 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc(0x10);
            }
            else {
              pvVar8 = realloc(pvVar8,0x10);
            }
            uVar13 = 0x10;
          }
          else {
            uVar15 = uVar13 * 2;
            if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
              uVar13 = uVar15;
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc((ulong)uVar15);
              }
              else {
                pvVar8 = realloc(pvVar8,(ulong)uVar15);
              }
            }
          }
        }
        puVar7 = local_70;
        pcVar9 = local_88;
        *(char *)((long)pvVar8 + lVar19 + (int)uVar17) = cVar1;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 9);
      local_70[1] = uVar17 + 9;
      *local_70 = uVar13;
      *(void **)(local_70 + 2) = pvVar8;
      sVar10 = strlen(local_88);
      if (0 < (int)(uint)sVar10) {
        uVar17 = puVar7[1];
        uVar13 = *puVar7;
        pvVar8 = *(void **)(puVar7 + 2);
        uVar18 = 0;
        do {
          cVar1 = pcVar9[uVar18];
          if (uVar17 + (int)uVar18 == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (pvVar8 == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(pvVar8,0x10);
              }
              uVar13 = 0x10;
            }
            else {
              uVar15 = uVar13 * 2;
              if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
                uVar13 = uVar15;
                if (pvVar8 == (void *)0x0) {
                  pvVar8 = malloc((ulong)uVar15);
                }
                else {
                  pvVar8 = realloc(pvVar8,(ulong)uVar15);
                }
              }
            }
          }
          *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar17) = cVar1;
          uVar18 = uVar18 + 1;
        } while (((uint)sVar10 & 0x7fffffff) != uVar18);
        local_70[1] = uVar17 + (int)uVar18;
        *local_70 = uVar13;
        *(void **)(local_70 + 2) = pvVar8;
        puVar7 = local_70;
      }
      if (0 < (int)local_80) {
        local_38 = (ulong)local_80 & 0xffffffff;
        puVar20 = (uint *)0x0;
        do {
          uVar17 = *puVar7;
          if (puVar7[1] == uVar17) {
            if ((int)uVar17 < 0x10) {
              if (*(void **)(puVar7 + 2) == (void *)0x0) {
                pvVar8 = malloc(0x10);
              }
              else {
                pvVar8 = realloc(*(void **)(puVar7 + 2),0x10);
              }
              sVar10 = 0x10;
            }
            else {
              sVar10 = (ulong)uVar17 * 2;
              if ((int)sVar10 <= (int)uVar17) goto LAB_002bdf46;
              if (*(void **)(puVar7 + 2) == (void *)0x0) {
                pvVar8 = malloc(sVar10);
              }
              else {
                pvVar8 = realloc(*(void **)(puVar7 + 2),sVar10);
              }
            }
            *(void **)(puVar7 + 2) = pvVar8;
            *puVar7 = (uint)sVar10;
          }
LAB_002bdf46:
          uVar17 = puVar7[1];
          puVar7[1] = uVar17 + 1;
          *(undefined1 *)(*(long *)(puVar7 + 2) + (long)(int)uVar17) = 0x20;
          pcVar9 = local_68[(long)puVar20];
          sVar10 = strlen(pcVar9);
          if (0 < (int)(uint)sVar10) {
            uVar17 = puVar7[1];
            uVar13 = *puVar7;
            pvVar8 = *(void **)(puVar7 + 2);
            uVar18 = 0;
            local_80 = puVar20;
            do {
              cVar1 = pcVar9[uVar18];
              if (uVar17 + (int)uVar18 == uVar13) {
                if ((int)uVar13 < 0x10) {
                  if (pvVar8 == (void *)0x0) {
                    pvVar8 = malloc(0x10);
                  }
                  else {
                    pvVar8 = realloc(pvVar8,0x10);
                  }
                  uVar13 = 0x10;
                }
                else {
                  uVar15 = uVar13 * 2;
                  if (SBORROW4(uVar13,uVar15) != 0 < (int)uVar13) {
                    uVar13 = uVar15;
                    if (pvVar8 == (void *)0x0) {
                      pvVar8 = malloc((ulong)uVar15);
                    }
                    else {
                      pvVar8 = realloc(pvVar8,(ulong)uVar15);
                    }
                  }
                }
              }
              *(char *)((long)pvVar8 + uVar18 + (long)(int)uVar17) = cVar1;
              uVar18 = uVar18 + 1;
            } while (((uint)sVar10 & 0x7fffffff) != uVar18);
            local_70[1] = uVar17 + (int)uVar18;
            *local_70 = uVar13;
            *(void **)(local_70 + 2) = pvVar8;
            puVar7 = local_70;
            puVar20 = local_80;
          }
          puVar20 = (uint *)((long)puVar20 + 1);
        } while (puVar20 != (uint *)local_38);
      }
      uVar17 = *puVar7;
      if (puVar7[1] == uVar17) {
        if ((int)uVar17 < 0x10) {
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x10);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),0x10);
          }
          sVar10 = 0x10;
        }
        else {
          sVar10 = (ulong)uVar17 * 2;
          if ((int)sVar10 <= (int)uVar17) goto LAB_002be40a;
          if (*(void **)(puVar7 + 2) == (void *)0x0) {
            pvVar8 = malloc(sVar10);
          }
          else {
            pvVar8 = realloc(*(void **)(puVar7 + 2),sVar10);
          }
        }
        *(void **)(puVar7 + 2) = pvVar8;
        *puVar7 = (uint)sVar10;
      }
LAB_002be40a:
      uVar17 = puVar7[1];
      puVar7[1] = uVar17 + 1;
      *(undefined1 *)(*(long *)(puVar7 + 2) + (long)(int)uVar17) = 0;
      iVar4 = clock_gettime(3,&local_48);
      if (iVar4 < 0) {
        iVar4 = 1;
      }
      else {
        iVar4 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8) >> 7) -
                (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),0xc) >> 0x1f)) +
                (int)local_48.tv_sec * -1000000;
      }
      iVar5 = Util_SignalSystem(*(char **)(puVar7 + 2));
      if (iVar5 != 0) {
        Abc_Print(-1,"The following command has returned non-zero exit status:\n");
        local_88 = *(char **)(puVar7 + 2);
        pcVar9 = "\"%s\"\n";
LAB_002be48e:
        Abc_Print(-1,pcVar9,local_88);
        return 1;
      }
      iVar5 = clock_gettime(3,&local_48);
      if (iVar5 < 0) {
        iVar5 = -1;
      }
      else {
        iVar5 = (int)(local_48.tv_nsec / 1000) + (int)local_48.tv_sec * 1000000;
      }
      if (*(void **)(puVar7 + 2) != (void *)0x0) {
        free(*(void **)(puVar7 + 2));
        puVar7[2] = 0;
        puVar7[3] = 0;
      }
      free(puVar7);
      __stream = fopen(local_88,"r");
      if (__stream == (FILE *)0x0) {
        pcVar9 = "There is no output file \"%s\".\n";
        goto LAB_002be48e;
      }
      fclose(__stream);
      iVar6 = Extra_FileSize(local_88);
      if (iVar6 < 1) goto LAB_002be756;
      iVar6 = Abc_ManReadStatus(local_88,"result:");
      pAVar2 = local_58;
      local_58->Status = iVar6;
      iVar6 = Abc_ManReadInteger(local_88,"bug-free-depth:");
      pAVar2->nFrames = iVar6;
      pVVar11 = Abc_ManReadBinary(local_88,"abstraction:");
      pAVar2->pGia->vFlopClasses = pVVar11;
      pVVar11 = Abc_ManReadBinary(local_88,"counter-example:");
      ppGVar3 = local_50;
      if (pVVar11 != (Vec_Int_t *)0x0) {
        iVar6 = (*local_50)->nRegs;
        __ptr = pVVar11;
        if ((pVVar11->nSize - iVar6) % ((*local_50)->vCis->nSize - iVar6) != 0) {
          Abc_Print(1,"Adjusting counter-example by adding zeros for PIs without fanout.\n");
          __ptr = Abc_ManExpandCex(*ppGVar3,pVVar11);
          Vec_IntFree(pVVar11);
        }
        pGVar12 = *ppGVar3;
        iVar6 = pGVar12->nRegs;
        iVar14 = pGVar12->vCis->nSize - iVar6;
        iVar6 = __ptr->nSize - iVar6;
        if (iVar6 % iVar14 == 0) {
          uVar17 = iVar6 / iVar14 - 1;
          pcVar9 = "Problem is satisfiable. Found counter-example in frame %d.  ";
          Abc_Print(1,"Problem is satisfiable. Found counter-example in frame %d.  ",(ulong)uVar17);
          Abc_PrintTime(iVar5 + iVar4,pcVar9,time);
          pAVar2 = local_58;
          if (local_58->pCex != (Abc_Cex_t *)0x0) {
            free(local_58->pCex);
            pAVar2->pCex = (Abc_Cex_t *)0x0;
          }
          iVar4 = pAVar2->pGia->nRegs;
          p = Abc_CexCreate(iVar4,pAVar2->pGia->vCis->nSize - iVar4,__ptr->pArray,uVar17,0,0);
          pAVar2->pCex = p;
          iVar4 = Gia_ManFindFailedPoCex(pAVar2->pGia,p,0);
          pAVar2->pCex->iPo = iVar4;
          if (iVar4 != -1) {
            pcVar9 = "Returned counter-example successfully verified in ABC.\n";
            goto LAB_002be6fc;
          }
          Abc_Print(1,"Generated counter-example is INVALID.\n");
          if (pAVar2->pCex != (Abc_Cex_t *)0x0) {
            free(pAVar2->pCex);
            pAVar2->pCex = (Abc_Cex_t *)0x0;
          }
        }
        else {
          pcVar9 = "Counter example has a wrong length.\n";
LAB_002be6fc:
          Abc_Print(1,pcVar9);
        }
        if (__ptr != (Vec_Int_t *)0x0) {
          if (__ptr->pArray != (int *)0x0) {
            free(__ptr->pArray);
            __ptr->pArray = (int *)0x0;
          }
          free(__ptr);
        }
      }
      pGVar12 = Abc_ManReadAig(local_88,"aig:");
      ppGVar3 = local_50;
      if (pGVar12 != (Gia_Man_t *)0x0) {
        Gia_ManStopP(local_50);
        *ppGVar3 = pGVar12;
      }
LAB_002be756:
      uVar17 = local_5c;
      Util_SignalTmpFileRemove(local_78,local_5c);
      Util_SignalTmpFileRemove(local_88,uVar17);
      if (local_78 != (char *)0x0) {
        free(local_78);
        local_78 = (char *)0x0;
      }
      if (local_88 != (char *)0x0) {
        free(local_88);
        return 0;
      }
      return 0;
    }
    if (local_78 != (char *)0x0) {
      free(local_78);
      local_78 = (char *)0x0;
    }
  }
  pcVar9 = "Cannot create a temporary file.\n";
LAB_002bda10:
  Abc_Print(-1,pcVar9);
  return 1;
}

Assistant:

int Cmd_CommandAbcPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileIn, * pFileOut;
    Vec_Str_t * vCommand;
    Vec_Int_t * vCex;
    FILE * pFile;
    Gia_Man_t * pGia;
    int i, fd;
    abctime clk;
    int fLeaveFiles;
/*
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Current network does not exist\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pNtk) )
    {
        Abc_Print( -1, "The current network is not an AIG. Cannot continue.\n" );
        return 1;
    }
*/

    if ( pAbc->pGia == NULL )
    {
        if (argc == 2 && strcmp(argv[1], "-h") == 0)
        {
            // Run command to produce help string:
            vCommand = Vec_StrAlloc( 100 );
            Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
            Vec_StrAppend( vCommand, " -abc " );
            Vec_StrAppend( vCommand, argv[0] );
            Vec_StrAppend( vCommand, " -h" );
            Vec_StrPush( vCommand, 0 );
            Util_SignalSystem( Vec_StrArray(vCommand) );
            Vec_StrFree( vCommand );
        }
        else
        {
            Abc_Print( -1, "Current AIG does not exist (try command &ps).\n" );
        }
        return 1;
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".aig", &pFileIn );
    if ( fd == -1 )
    {
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".out", &pFileOut );
    if ( fd == -1 )
    {
        ABC_FREE( pFileIn );
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif


    // write current network into a file
/*
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig;
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Ioa_WriteAiger( pAig, pFileIn, 0, 0 );
        Aig_ManStop( pAig );
    }
*/ 
    // check what to do with the files
    fLeaveFiles = 0;
    if ( strcmp( argv[argc-1], "!" ) == 0 )
    {
        Abc_Print( 0, "Input file \"%s\" and output file \"%s\" are not deleted.\n", pFileIn, pFileOut );
        fLeaveFiles = 1;
        argc--;
    }

    // create input file
    Gia_AigerWrite( pAbc->pGia, pFileIn, 0, 0 );

    // create command line
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
    // add input/output file
    Vec_StrAppend( vCommand, " -abc" );
//    Vec_StrAppend( vCommand, " -input=C:/_projects/abc/_TEST/hwmcc/139442p0.aig" );
    Vec_StrAppend( vCommand, " -input=" );
    Vec_StrAppend( vCommand, pFileIn );
    Vec_StrAppend( vCommand, " -output=" );
    Vec_StrAppend( vCommand, pFileOut );
    // add other arguments
    for ( i = 0; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );

    // run the command line
//printf( "Running command line: %s\n", Vec_StrArray(vCommand) ); 

    clk = Abc_Clock();
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    clk = Abc_Clock() - clk;
    Vec_StrFree( vCommand );

    // check if the output file exists
    if ( (pFile = fopen( pFileOut, "r" )) == NULL )
    {
        Abc_Print( -1, "There is no output file \"%s\".\n", pFileOut );
        return 1;
    }
    fclose( pFile );

    // process the output
    if ( Extra_FileSize(pFileOut) > 0 )
    {
        // get status
        pAbc->Status  = Abc_ManReadStatus( pFileOut, "result:" );
        // get bug-free depth
        pAbc->nFrames = Abc_ManReadInteger( pFileOut, "bug-free-depth:" );
        // get abstraction
        pAbc->pGia->vFlopClasses = Abc_ManReadBinary( pFileOut, "abstraction:" );
        // get counter-example
        vCex = Abc_ManReadBinary( pFileOut, "counter-example:" );
        if ( vCex ) 
        {
            int nFrames, nRemain;

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
            {   
                Vec_Int_t * vTemp;
                Abc_Print( 1, "Adjusting counter-example by adding zeros for PIs without fanout.\n" );
                // expand the counter-example to include PIs without fanout
                vCex = Abc_ManExpandCex( pAbc->pGia, vTemp = vCex );
                Vec_IntFree( vTemp );
            }

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
                Abc_Print( 1, "Counter example has a wrong length.\n" );
            else
            {
                Abc_Print( 1, "Problem is satisfiable. Found counter-example in frame %d.  ", nFrames-1 );
                Abc_PrintTime( 1, "Time", clk );
                ABC_FREE( pAbc->pCex );
                pAbc->pCex = Abc_CexCreate( Gia_ManRegNum(pAbc->pGia), Gia_ManPiNum(pAbc->pGia), Vec_IntArray(vCex), nFrames-1, 0, 0 );

//                Abc_CexPrint( pAbc->pCex );

//                if ( !Gia_ManVerifyCex( pAbc->pGia, pAbc->pCex, 0 ) )
//                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );

                // remporary work-around to detect the output number - October 18, 2010
                pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, 0 );
                if ( pAbc->pCex->iPo == -1 )
                {
                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );
                    ABC_FREE( pAbc->pCex );
                }
                else
                {
                    Abc_Print( 1, "Returned counter-example successfully verified in ABC.\n" );
                }
            }
            Vec_IntFreeP( &vCex );
        }
        // get AIG if present
        pGia = Abc_ManReadAig( pFileOut, "aig:" );
        if ( pGia != NULL )
        {
            Gia_ManStopP( &pAbc->pGia );
            pAbc->pGia = pGia;                
        }
    }    

    // clean up
    Util_SignalTmpFileRemove( pFileIn, fLeaveFiles );
    Util_SignalTmpFileRemove( pFileOut, fLeaveFiles );
    
    ABC_FREE( pFileIn );
    ABC_FREE( pFileOut );
    return 0;
}